

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O1

bool __thiscall
glu::SubTypeIterator<glu::IsBasicType>::operator!=
          (SubTypeIterator<glu::IsBasicType> *this,SubTypeIterator<glu::IsBasicType> *other)

{
  int iVar1;
  pointer pVVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  int *piVar6;
  bool bVar7;
  
  if (this->m_type != other->m_type) {
    return true;
  }
  pVVar2 = (this->m_path).
           super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar3 = (this->m_path).
           super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pVVar5 = (other->m_path).
           super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((long)pVVar3 - (long)pVVar2 ==
      (long)(other->m_path).
            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)pVVar5) {
    bVar7 = pVVar2 == pVVar3;
    if (((!bVar7) && (bVar7 = false, pVVar2->type == pVVar5->type)) &&
       (pVVar2->index == pVVar5->index)) {
      piVar6 = &pVVar5[1].index;
      do {
        pVVar5 = pVVar2 + 1;
        bVar7 = pVVar5 == pVVar3;
        if ((bVar7) || (bVar7 = false, pVVar5->type != ((VarTypeComponent *)(piVar6 + -1))->type))
        break;
        iVar1 = *piVar6;
        piVar6 = piVar6 + 2;
        pVVar4 = pVVar2 + 1;
        pVVar2 = pVVar5;
      } while (pVVar4->index == iVar1);
    }
  }
  else {
    bVar7 = false;
  }
  return (bool)(bVar7 ^ 1);
}

Assistant:

bool								operator!=			(const SubTypeIterator<IsExpanded>& other) const { return m_type != other.m_type || m_path != other.m_path; }